

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall ieee754::set_raw_exp(ieee754 *this,int e)

{
  byte bVar1;
  int iVar2;
  int mask;
  int e_local;
  ieee754 *this_local;
  
  if (this->ebits < 8) {
    bVar1 = (byte)(0xff << (7U - (char)this->ebits & 0x1f)) & 0x7f;
    iVar2 = this->bytes + -1;
    this->buf[iVar2] = this->buf[iVar2] & (bVar1 ^ 0xff);
    iVar2 = this->bytes + -1;
    this->buf[iVar2] = this->buf[iVar2] | (byte)(e << (7U - (char)this->ebits & 0x1f)) & bVar1;
  }
  else if (this->ebits < 0x10) {
    iVar2 = this->bytes + -1;
    this->buf[iVar2] = this->buf[iVar2] & 0x80;
    iVar2 = this->bytes + -1;
    this->buf[iVar2] = this->buf[iVar2] | (byte)(e >> ((char)this->ebits - 7U & 0x1f)) & 0x7f;
    bVar1 = (byte)(0xff << (0xfU - (char)this->ebits & 0x1f));
    iVar2 = this->bytes + -2;
    this->buf[iVar2] = this->buf[iVar2] & (bVar1 ^ 0xff);
    iVar2 = this->bytes + -2;
    this->buf[iVar2] = this->buf[iVar2] | (byte)(e << (0xfU - (char)this->ebits & 0x1f)) & bVar1;
  }
  return;
}

Assistant:

void set_raw_exp(int e)
    {
        int mask;
        if (ebits <= 7)
        {
            /* it fits entirely in the first byte */
            mask = (0xff << (7 - ebits)) & 0x7f;
            buf[bytes-1] &= ~mask;
            buf[bytes-1] |= (e << (7 - ebits)) & mask;
        }
        else if (ebits <= 15)
        {
            /* it fits in the first two bytes */
            buf[bytes-1] &= 0x80;
            buf[bytes-1] |= (e >> (ebits - 7)) & 0x7f;
            
            mask = (0xff << (15 - ebits)) & 0xff;
            buf[bytes-2] &= ~mask;
            buf[bytes-2] |= (e << (15 - ebits)) & mask;
        }
        else
        {
            /* we don't currently handle anything above quad precision */
            assert(FALSE);
        }
    }